

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void verifyOrthonormal<Imath_3_2::Matrix33<float>>(Matrix33<float> *A,BaseType_conflict2 threshold)

{
  uint uVar1;
  uint uVar2;
  Matrix33<float> *in_RDI;
  Matrix33<float> *pMVar3;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  uint j;
  uint i;
  Matrix33<float> prod;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar4;
  uint i_00;
  undefined4 in_stack_ffffffffffffffac;
  Matrix33<float> local_30;
  float local_c;
  
  local_c = in_XMM0_Da;
  Imath_3_2::Matrix33<float>::transposed(in_RDI);
  Imath_3_2::Matrix33<float>::operator*
            ((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (Matrix33<float> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  uVar4 = 0;
  do {
    i_00 = uVar4;
    uVar1 = Imath_3_2::Matrix33<float>::dimensions();
    if (uVar1 <= uVar4) {
      return;
    }
    uVar4 = 0;
    while (uVar1 = uVar4, uVar2 = Imath_3_2::Matrix33<float>::dimensions(), uVar4 < uVar2) {
      if (i_00 == uVar1) {
        pMVar3 = &local_30;
        Imath_3_2::Matrix33<float>::operator[](pMVar3,i_00);
        std::abs((int)pMVar3);
        if (local_c <= extraout_XMM0_Da) {
          __assert_fail("std::abs (prod[i][j] - 1) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x3c,
                        "void verifyOrthonormal(const TM &, const typename TM::BaseType) [TM = Imath_3_2::Matrix33<float>]"
                       );
        }
      }
      else {
        pMVar3 = &local_30;
        Imath_3_2::Matrix33<float>::operator[](pMVar3,i_00);
        std::abs((int)pMVar3);
        if (local_c <= extraout_XMM0_Da_00) {
          __assert_fail("std::abs (prod[i][j]) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x3e,
                        "void verifyOrthonormal(const TM &, const typename TM::BaseType) [TM = Imath_3_2::Matrix33<float>]"
                       );
        }
      }
      uVar4 = uVar1 + 1;
    }
    uVar4 = i_00 + 1;
  } while( true );
}

Assistant:

void
verifyOrthonormal (const TM& A, const typename TM::BaseType threshold)
{
    const TM prod = A * A.transposed ();
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < threshold);
            else
                assert (std::abs (prod[i][j]) < threshold);
}